

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O2

tensor * __thiscall EXP::forward(EXP *this,vector<tensor_*,_std::allocator<tensor_*>_> *x)

{
  undefined4 uVar1;
  undefined4 uVar2;
  tensor *ptVar3;
  double dVar4;
  
  (this->super_node).isbuild = true;
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->super_node).grad_fn,
             (long)(x->super__Vector_base<tensor_*,_std::allocator<tensor_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(x->super__Vector_base<tensor_*,_std::allocator<tensor_*>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::vector<tensor_*,_std::allocator<tensor_*>_>::operator=(&(this->super_node).input,x);
  ptVar3 = (tensor *)operator_new(0x20);
  ptVar3->data = 0.0;
  ptVar3->grad = 0.0;
  ptVar3->cnt = 0;
  ptVar3->cnt_free = 0;
  ptVar3->hook = (node *)0x0;
  tensor::tensor_cnt = tensor::tensor_cnt + 1;
  (this->super_node).ret = ptVar3;
  dVar4 = exp((*(this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>.
                _M_impl.super__Vector_impl_data._M_start)->data);
  ((this->super_node).ret)->data = dVar4;
  dVar4 = exp((*(this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>.
                _M_impl.super__Vector_impl_data._M_start)->data);
  *(this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
   super__Vector_impl_data._M_start = dVar4;
  ptVar3 = *(this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  uVar1 = ptVar3->cnt;
  uVar2 = ptVar3->cnt_free;
  ptVar3->cnt = uVar1 + 1;
  ptVar3->cnt_free = uVar2 + 1;
  ptVar3 = (this->super_node).ret;
  ptVar3->hook = &this->super_node;
  return ptVar3;
}

Assistant:

tensor* forward(vector<tensor *> x){
        isbuild=true;
        grad_fn.resize(x.size());
        input = x;
        ret = new tensor();
        ret->data = exp(input[0]->data);
        grad_fn[0] = exp(input[0]->data);
        input[0]->cnt++;
        input[0]->cnt_free++;
        ret->hook=this;
        return ret;
    }